

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall
ON_Viewport::Extents(ON_Viewport *this,double angle,ON_3dPoint *center,double radius)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  ON_3dVector local_68;
  ON_3dVector local_50;
  ON_3dPoint local_38;
  
  iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
  if (((((char)iVar3 != '\0') && (angle < 1.5707963033882073)) && (0.0 < angle)) && (0.0 < radius))
  {
    dVar4 = sin(angle);
    dVar4 = radius / dVar4;
    if (this->m_projection != perspective_view) {
      dVar4 = dVar4 + radius * 1.0625;
    }
    dVar1 = radius * -1.0625 + dVar4;
    dVar7 = radius * 0.0625;
    if (radius * 0.0625 <= dVar1) {
      dVar7 = dVar1;
    }
    dVar1 = this->m__MIN_NEAR_DIST;
    uVar5 = SUB84(dVar1,0);
    uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
    if (dVar1 <= dVar7) {
      uVar5 = SUB84(dVar7,0);
      uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
    }
    local_68.z = (this->m_CamZ).z;
    local_68.x = (this->m_CamZ).x;
    local_68.y = (this->m_CamZ).y;
    ::operator*(&local_50,dVar4,&local_68);
    ON_3dPoint::operator+(&local_38,center,&local_50);
    SetCameraLocation(this,&local_38);
    bVar2 = SetFrustumNearFar(this,(double)CONCAT44(uVar6,uVar5),radius * 1.0625 + dVar4);
    if ((bVar2) && (bVar2 = SetCameraAngle(this,angle), bVar2)) {
      iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this,0);
      return (bool)(char)iVar3;
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::Extents( double angle, const ON_3dPoint& center, double radius )
{
  if ( !IsValid() )
    return false;

  double target_dist, near_dist, far_dist;

  if ( radius <= 0.0 || 
       angle  <= 0.0 || 
       angle  >= 0.5*ON_PI*(1.0-ON_SQRT_EPSILON) )
    return false;
  
  target_dist = radius/sin(angle);
  if ( !IsPerspectiveProjection() )
  {
    target_dist += 1.0625*radius;
  }
  near_dist = target_dist - 1.0625*radius;
  if ( near_dist < 0.0625*radius )
    near_dist = 0.0625*radius;
  if ( near_dist < m__MIN_NEAR_DIST )
    near_dist = m__MIN_NEAR_DIST;
  far_dist = target_dist +  1.0625*radius;

  SetCameraLocation( center + target_dist*CameraZ() );
  if ( !SetFrustumNearFar( near_dist, far_dist ) )
    return false;
  if ( !SetCameraAngle( angle ) )
    return false;

  return IsValid()?true:false;
}